

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_AddModifier::Run(void)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  NullModifier foo_modifier;
  
  cVar1 = ctemplate::AddModifier("x-atest",(TemplateModifier *)&ctemplate::html_escape);
  if (cVar1 == '\0') {
    pcVar3 = "ctemplate::AddModifier(\"x-atest\", &ctemplate::html_escape)";
  }
  else {
    cVar1 = ctemplate::AddModifier("x-atest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') {
      pcVar3 = "ctemplate::AddModifier(\"x-atest-arg=\", &ctemplate::html_escape)";
    }
    else {
      cVar1 = ctemplate::AddModifier("x-atest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
      if (cVar1 == '\0') {
        pcVar3 = "ctemplate::AddModifier(\"x-atest-arg=h\", &ctemplate::html_escape)";
      }
      else {
        cVar1 = ctemplate::AddModifier
                          ("x-atest-arg=html",(TemplateModifier *)&ctemplate::html_escape);
        if (cVar1 == '\0') {
          pcVar3 = "ctemplate::AddModifier(\"x-atest-arg=html\", &ctemplate::html_escape)";
        }
        else {
          cVar1 = ctemplate::AddModifier
                            ("x-atest-arg=json",(TemplateModifier *)&ctemplate::json_escape);
          if (cVar1 == '\0') {
            pcVar3 = "ctemplate::AddModifier(\"x-atest-arg=json\", &ctemplate::json_escape)";
          }
          else {
            cVar1 = ctemplate::AddModifier
                              ("x-atest-arg=j",(TemplateModifier *)&ctemplate::json_escape);
            if (cVar1 == '\0') {
              pcVar3 = "ctemplate::AddModifier(\"x-atest-arg=j\", &ctemplate::json_escape)";
            }
            else {
              cVar1 = ctemplate::AddModifier
                                ("x-atest-arg=J",(TemplateModifier *)&ctemplate::json_escape);
              if (cVar1 == '\0') {
                pcVar3 = "ctemplate::AddModifier(\"x-atest-arg=J\", &ctemplate::json_escape)";
              }
              else {
                cVar1 = ctemplate::AddModifier("test",(TemplateModifier *)&ctemplate::html_escape);
                if (cVar1 == '\0') {
                  cVar1 = ctemplate::AddModifier
                                    ("x-atest",(TemplateModifier *)&ctemplate::html_escape);
                  if (cVar1 == '\0') {
                    cVar1 = ctemplate::AddModifier
                                      ("x-atest-arg=",(TemplateModifier *)&ctemplate::html_escape);
                    if (cVar1 == '\0') {
                      cVar1 = ctemplate::AddModifier
                                        ("x-atest-arg=h",(TemplateModifier *)&ctemplate::html_escape
                                        );
                      if (cVar1 == '\0') {
                        cVar1 = ctemplate::AddModifier
                                          ("x-atest-arg=html",
                                           (TemplateModifier *)&ctemplate::html_escape);
                        if (cVar1 == '\0') {
                          lVar2 = ctemplate::FindModifier("x-atest",7,"",0);
                          if (lVar2 == 0) {
                            pcVar3 = "(info = ctemplate::FindModifier(\"x-atest\", 7, \"\", 0))";
                          }
                          else if (*(char *)(lVar2 + 0x21) == '\x01') {
                            pcVar3 = "!(info->modval_required)";
                          }
                          else {
                            lVar2 = ctemplate::FindModifier("x-foo",5,"",0);
                            if (lVar2 == 0) {
LAB_0011099e:
                              pcVar3 = "(info = ctemplate::FindModifier(\"x-foo\", 5, \"\", 0))";
                            }
                            else if (*(char *)(lVar2 + 0x22) == '\x01') {
                              pcVar3 = "!(info->is_registered)";
                            }
                            else {
                              _foo_modifier = ctemplate::GetDefaultModifierForXml;
                              cVar1 = ctemplate::AddModifier
                                                ("x-foo",(TemplateModifier *)&foo_modifier);
                              if (cVar1 != '\0') {
                                lVar2 = ctemplate::FindModifier("x-foo",5,"",0);
                                if (lVar2 != 0) {
                                  if (*(TemplateModifier **)(lVar2 + 0x28) ==
                                      (TemplateModifier *)&foo_modifier) {
                                    ctemplate::TemplateModifier::~TemplateModifier
                                              ((TemplateModifier *)&foo_modifier);
                                    return;
                                  }
                                  fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==",
                                          "&foo_modifier");
                                  goto LAB_00110b81;
                                }
                                goto LAB_0011099e;
                              }
                              pcVar3 = "ctemplate::AddModifier(\"x-foo\", &foo_modifier)";
                            }
                          }
                        }
                        else {
                          pcVar3 = 
                          "!(ctemplate::AddModifier(\"x-atest-arg=html\", &ctemplate::html_escape))"
                          ;
                        }
                      }
                      else {
                        pcVar3 = 
                        "!(ctemplate::AddModifier(\"x-atest-arg=h\", &ctemplate::html_escape))";
                      }
                    }
                    else {
                      pcVar3 = 
                      "!(ctemplate::AddModifier(\"x-atest-arg=\", &ctemplate::html_escape))";
                    }
                  }
                  else {
                    pcVar3 = "!(ctemplate::AddModifier(\"x-atest\", &ctemplate::html_escape))";
                  }
                }
                else {
                  pcVar3 = "!(ctemplate::AddModifier(\"test\", &ctemplate::html_escape))";
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar3);
LAB_00110b81:
  exit(1);
}

Assistant:

TEST(TemplateModifiers, AddModifier) {
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=h", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=html", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=json", &GOOGLE_NAMESPACE::json_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=j", &GOOGLE_NAMESPACE::json_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=J", &GOOGLE_NAMESPACE::json_escape));

  // Make sure AddModifier fails with an invalid name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("test", &GOOGLE_NAMESPACE::html_escape));

  // Make sure AddModifier fails with a duplicate name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=h", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=html", &GOOGLE_NAMESPACE::html_escape));

  const GOOGLE_NAMESPACE::ModifierInfo* info;
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-atest", 7, "", 0)));
  EXPECT_FALSE(info->modval_required);

  // Make sure we can still add a modifier after having already
  // searched for it.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_FALSE(info->is_registered);

  GOOGLE_NAMESPACE::NullModifier foo_modifier;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-foo", &foo_modifier));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_EQ(info->modifier, &foo_modifier);
}